

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBlock(TranslateToFuzzReader *this,Type type)

{
  Block *pBVar1;
  bool bVar2;
  ExpressionList *pEVar3;
  Expression *pEVar4;
  optional<wasm::Type> type_00;
  bool local_e9;
  byte local_b9;
  optional<wasm::Type> local_a8;
  Type local_98;
  BasicType local_8c [3];
  _Storage<wasm::Type,_true> local_80;
  undefined1 local_78;
  _Storage<wasm::Type,_true> local_70;
  undefined1 local_68;
  TranslateToFuzzReader *local_60;
  Type local_58;
  Type local_50;
  uint local_44;
  Block *pBStack_40;
  Index num;
  string_view local_38;
  Block *local_28;
  Block *ret;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ret = (Block *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_28 = Builder::makeBlock(&this->builder,(Expression *)0x0);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       (uintptr_t)this_local;
  local_38 = (string_view)makeLabel(this);
  Name::operator=(&local_28->name,(Name *)&local_38);
  pBStack_40 = local_28;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->funcContext->breakableStack,(value_type *)&stack0xffffffffffffffc0);
  local_44 = upToSquared(this,(this->fuzzParams->super_FuzzParams).BLOCK_FACTOR - 1);
  if ((((this->fuzzParams->super_FuzzParams).NESTING_LIMIT / 2 <= this->nesting) &&
      (local_44 = local_44 >> 1, (this->fuzzParams->super_FuzzParams).NESTING_LIMIT <= this->nesting
      )) && (bVar2 = oneIn(this,2), bVar2)) {
    local_44 = local_44 >> 1;
  }
  if ((local_44 == 0) && (bVar2 = oneIn(this,10), !bVar2)) {
    local_44 = local_44 + 1;
  }
  while( true ) {
    local_b9 = 0;
    if (local_44 != 0) {
      bVar2 = Random::finished(&this->random);
      local_b9 = bVar2 ^ 0xff;
    }
    if ((local_b9 & 1) == 0) break;
    pEVar3 = &local_28->list;
    Type::Type(&local_50,none);
    pEVar4 = make(this,local_50);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    local_44 = local_44 - 1;
  }
  bVar2 = Random::finished(&this->random);
  if (((bVar2) || (bVar2 = Type::isConcrete((Type *)&this_local), !bVar2)) ||
     (bVar2 = oneIn(this,2), !bVar2)) {
    pEVar3 = &local_28->list;
    local_60 = this_local;
    pEVar4 = make(this,(Type)this_local);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
  }
  else {
    pEVar3 = &local_28->list;
    Type::Type(&local_58,unreachable);
    pEVar4 = makeBreak(this,local_58);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
            (&this->funcContext->breakableStack);
  bVar2 = Type::isConcrete((Type *)&this_local);
  pBVar1 = local_28;
  if (bVar2) {
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)&local_70._M_value,(Type *)&this_local);
    wasm::Block::finalize(pBVar1,local_70,local_68,0);
  }
  else {
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_80);
    wasm::Block::finalize(pBVar1,local_80,local_78,0);
  }
  bVar2 = Type::operator!=(&(local_28->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type,(Type *)&this_local);
  if (bVar2) {
    local_8c[1] = 1;
    bVar2 = Type::operator==((Type *)&this_local,local_8c + 1);
    local_e9 = false;
    if (bVar2) {
      local_8c[0] = none;
      local_e9 = Type::operator==(&(local_28->super_SpecificExpression<(wasm::Expression::Id)1>).
                                   super_Expression.type,local_8c);
    }
    pBVar1 = local_28;
    if (local_e9 == false) {
      __assert_fail("type == Type::unreachable && ret->type == Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x91b,"Expression *wasm::TranslateToFuzzReader::makeBlock(Type)");
    }
    Type::Type(&local_98,unreachable);
    pEVar4 = make(this,local_98);
    std::optional<wasm::Type>::optional(&local_a8);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    type_local.id =
         (uintptr_t)Builder::makeSequence(&this->builder,(Expression *)pBVar1,pEVar4,type_00);
  }
  else {
    type_local.id = (uintptr_t)local_28;
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeBlock(Type type) {
  auto* ret = builder.makeBlock();
  ret->type = type; // so we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  Index num = upToSquared(fuzzParams->BLOCK_FACTOR - 1); // we add another later
  if (nesting >= fuzzParams->NESTING_LIMIT / 2) {
    // smaller blocks past the limit
    num /= 2;
    if (nesting >= fuzzParams->NESTING_LIMIT && oneIn(2)) {
      // smaller blocks past the limit
      num /= 2;
    }
  }
  // not likely to have a block of size 1
  if (num == 0 && !oneIn(10)) {
    num++;
  }
  while (num > 0 && !random.finished()) {
    ret->list.push_back(make(Type::none));
    num--;
  }
  // give a chance to make the final element an unreachable break, instead
  // of concrete - a common pattern (branch to the top of a loop etc.)
  if (!random.finished() && type.isConcrete() && oneIn(2)) {
    ret->list.push_back(makeBreak(Type::unreachable));
  } else {
    ret->list.push_back(make(type));
  }
  funcContext->breakableStack.pop_back();
  if (type.isConcrete()) {
    ret->finalize(type);
  } else {
    ret->finalize();
  }
  if (ret->type != type) {
    // e.g. we might want an unreachable block, but a child breaks to it
    assert(type == Type::unreachable && ret->type == Type::none);
    return builder.makeSequence(ret, make(Type::unreachable));
  }
  return ret;
}